

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O1

void __thiscall
glslang::TSmallArrayVector::copyNonFront(TSmallArrayVector *this,TSmallArrayVector *rhs)

{
  TVector<glslang::TArraySize> *pTVar1;
  
  if (this->sizes != (TVector<glslang::TArraySize> *)0x0) {
    __assert_fail("sizes == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0xa5,"void glslang::TSmallArrayVector::copyNonFront(const TSmallArrayVector &)");
  }
  pTVar1 = rhs->sizes;
  if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
     (1 < (int)((ulong)((long)(pTVar1->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar1->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    alloc(this);
    std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<glslang::TArraySize*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>>
              ((vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)
               this->sizes,
               *(undefined8 *)
                ((vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)
                 this->sizes + 8),
               (rhs->sizes->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               (rhs->sizes->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  return;
}

Assistant:

void copyNonFront(const TSmallArrayVector& rhs)
    {
        assert(sizes == nullptr);
        if (rhs.size() > 1) {
            alloc();
            sizes->insert(sizes->begin(), rhs.sizes->begin() + 1, rhs.sizes->end());
        }
    }